

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::CopyPropDstUses(GlobOpt *this,Opnd *opnd,Instr *instr,Value *src1Val)

{
  bool bVar1;
  SymOpnd *symOpnd;
  PropertySym *pPVar2;
  Value *pVVar3;
  ValueType *pVVar4;
  
  bVar1 = IR::Opnd::IsSymOpnd(opnd);
  if (bVar1) {
    symOpnd = IR::Opnd::AsSymOpnd(opnd);
    if (symOpnd->m_sym->m_kind == SymKindProperty) {
      pPVar2 = Sym::AsPropertySym(symOpnd->m_sym);
      pVVar3 = GlobOptBlockData::FindValue
                         (&this->currentBlock->globOptData,&pPVar2->m_stackSym->super_Sym);
      if (pVVar3 == (Value *)0x0) {
        pVVar4 = &ValueType::Uninitialized;
      }
      else {
        pVVar4 = &pVVar3->valueInfo->super_ValueType;
      }
      (symOpnd->propertyOwnerValueType).field_0 = pVVar4->field_0;
      CopyPropPropertySymObj(this,symOpnd,instr);
      return;
    }
  }
  return;
}

Assistant:

void
GlobOpt::CopyPropDstUses(IR::Opnd *opnd, IR::Instr *instr, Value *src1Val)
{
    if (opnd->IsSymOpnd())
    {
        IR::SymOpnd *symOpnd = opnd->AsSymOpnd();

        if (symOpnd->m_sym->IsPropertySym())
        {
            PropertySym * originalPropertySym = symOpnd->m_sym->AsPropertySym();

            Value *const objectValue = CurrentBlockData()->FindValue(originalPropertySym->m_stackSym);
            symOpnd->SetPropertyOwnerValueType(objectValue ? objectValue->GetValueInfo()->Type() : ValueType::Uninitialized);

            this->CopyPropPropertySymObj(symOpnd, instr);
        }
    }
}